

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O1

bool __thiscall FParseContext::FindSym(FParseContext *this,char *sym,FParseSymbol **val)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  FParseSymbol *pFVar5;
  bool bVar6;
  
  uVar3 = (ulong)(this->symbols).Count;
  bVar6 = uVar3 != 0;
  if (bVar6) {
    pFVar5 = (this->symbols).Array;
    iVar2 = strcmp(pFVar5->Sym,sym);
    if (iVar2 != 0) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar3 == uVar4) {
          return uVar4 < uVar3;
        }
        iVar2 = strcmp(pFVar5[1].Sym,sym);
        pFVar5 = pFVar5 + 1;
        uVar1 = uVar4 + 1;
      } while (iVar2 != 0);
      bVar6 = uVar4 < uVar3;
    }
    *val = pFVar5;
  }
  return bVar6;
}

Assistant:

bool FParseContext::FindSym (char *sym, FParseSymbol **val)
{
	for(unsigned i=0;i<symbols.Size(); i++)
	{
		if (strcmp (symbols[i].Sym, sym) == 0)
		{
			*val = &symbols[i];
			return true;
		}
	}
	return false;
}